

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

UnknownFieldSet * __thiscall
google::protobuf::internal::InternalMetadata::
mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  undefined8 *puVar1;
  type_info *ptVar2;
  
  ptVar2 = (type_info *)this->ptr_;
  if (((ulong)ptVar2 & 1) != 0) {
    ptVar2 = *(type_info **)((ulong)ptVar2 & 0xfffffffffffffffe);
  }
  if (ptVar2 == (type_info *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
  }
  else {
    if (*(long *)(ptVar2 + 0x70) != 0) {
      google::protobuf::Arena::OnArenaAllocation
                (ptVar2,(ulong)&Container<google::protobuf::UnknownFieldSet>::typeinfo);
    }
    puVar1 = (undefined8 *)
             google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ulong)ptVar2,(_func_void_void_ptr *)0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
  }
  this->ptr_ = (void *)((ulong)puVar1 | 1);
  *puVar1 = ptVar2;
  return (UnknownFieldSet *)(puVar1 + 1);
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }